

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ClipLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_clip(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ClipLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_clip(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_clip(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ClipLayerParams>(arena);
    (this->layer_).clip_ = pCVar2;
  }
  return (ClipLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ClipLayerParams* NeuralNetworkLayer::_internal_mutable_clip() {
  if (!_internal_has_clip()) {
    clear_layer();
    set_has_clip();
    layer_.clip_ = CreateMaybeMessage< ::CoreML::Specification::ClipLayerParams >(GetArenaForAllocation());
  }
  return layer_.clip_;
}